

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::CLUFactor<double>::vSolveLeft2
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *vec2,double *rhs2,int *ridx2,int rn2)

{
  int iVar1;
  int rhsn;
  
  if ((this->l).updateType == 0) {
    iVar1 = solveUpdateLeft(this,eps,rhs,ridx,rn);
    iVar1 = solveUleft(this,eps,vec,idx,rhs,ridx,iVar1);
    rhsn = solveUpdateLeft(this,eps,rhs2,ridx2,rn2);
    solveUleftNoNZ(this,eps,vec2,rhs2,ridx2,rhsn);
  }
  else {
    iVar1 = solveUleft(this,eps,vec,idx,rhs,ridx,rn);
    iVar1 = solveLleftForest(this,eps,vec,idx,iVar1);
    solveUleftNoNZ(this,eps,vec2,rhs2,ridx2,rn2);
    solveLleftForestNoNZ(this,vec2);
  }
  iVar1 = solveLleft(this,eps,vec,idx,iVar1);
  solveLleftNoNZ(this,vec2);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft2(R eps,
                              R* vec, int* idx,                      /* result */
                              R* rhs, int* ridx, int rn,             /* rhs    */
                              R* vec2,                               /* result2 */
                              R* rhs2, int* ridx2, int rn2)        /* rhs2    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      solveLleftForestNoNZ(vec2);
   }

   rn = solveLleft(eps, vec, idx, rn);

   solveLleftNoNZ(vec2);

   return rn;
}